

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O3

void nhdp_domain_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  list_entity *plVar4;
  long lVar5;
  
  plVar3 = _domain_list.next;
  if ((_domain_list.next)->prev != _domain_list.prev) {
    do {
      plVar2 = plVar3->next;
      lVar5 = -0x260;
      do {
        rfc5444_writer_unregister_addrtlvtype
                  (&_protocol->writer,(rfc5444_writer_tlvtype *)((long)&plVar3->next + lVar5));
        lVar5 = lVar5 + 0x98;
      } while (lVar5 != 0);
      plVar4 = plVar3->prev;
      plVar1 = plVar3->next;
      plVar4->next = plVar1;
      plVar1->prev = plVar4;
      plVar3->prev = (list_entity *)0x0;
      plVar3->next = (list_entity *)0x0;
      oonf_class_free(&_domain_class,plVar3 + -0x2a);
      plVar3 = plVar2;
    } while (plVar2->prev != _domain_list.prev);
  }
  plVar3 = (_domain_metric_postprocessor_list.next)->prev;
  plVar2 = _domain_metric_postprocessor_list.prev;
  plVar4 = _domain_metric_postprocessor_list.next;
  if (plVar3 != _domain_metric_postprocessor_list.prev) {
    do {
      plVar1 = plVar4->next;
      if (plVar3 != (list_entity *)0x0 && plVar1 != (list_entity *)0x0) {
        plVar3->next = plVar1;
        plVar1->prev = plVar3;
        plVar4->next = (list_entity *)0x0;
        plVar4->prev = (list_entity *)0x0;
        plVar2 = _domain_metric_postprocessor_list.prev;
      }
      plVar3 = plVar1->prev;
      plVar4 = plVar1;
    } while (plVar3 != plVar2);
  }
  plVar3 = (_domain_listener_list.next)->prev;
  plVar2 = _domain_listener_list.prev;
  plVar4 = _domain_listener_list.next;
  if (plVar3 != _domain_listener_list.prev) {
    do {
      plVar1 = plVar4->next;
      if (plVar3 != (list_entity *)0x0 && plVar1 != (list_entity *)0x0) {
        plVar3->next = plVar1;
        plVar1->prev = plVar3;
        plVar4->next = (list_entity *)0x0;
        plVar4->prev = (list_entity *)0x0;
        plVar2 = _domain_listener_list.prev;
      }
      plVar3 = plVar1->prev;
      plVar4 = plVar1;
    } while (plVar3 != plVar2);
  }
  oonf_class_remove(&_domain_class);
  return;
}

Assistant:

void
nhdp_domain_cleanup(void) {
  struct nhdp_domain *domain, *d_it;
  struct nhdp_domain_listener *listener, *l_it;
  struct nhdp_domain_metric_postprocessor *processor, *p_it;
  int i;

  list_for_each_element_safe(&_domain_list, domain, _node, d_it) {
    /* free allocated TLVs */
    for (i = 0; i < 4; i++) {
      rfc5444_writer_unregister_addrtlvtype(&_protocol->writer, &domain->_metric_addrtlvs[i]);
    }

    /* remove domain */
    list_remove(&domain->_node);
    oonf_class_free(&_domain_class, domain);
  }

  list_for_each_element_safe(&_domain_metric_postprocessor_list, processor, _node, p_it) {
    nhdp_domain_metric_postprocessor_remove(processor);
  }
  list_for_each_element_safe(&_domain_listener_list, listener, _node, l_it) {
    nhdp_domain_listener_remove(listener);
  }
  oonf_class_remove(&_domain_class);
}